

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O3

void __thiscall ANN::load(ANN *this,string *filepath,bool reinitialize)

{
  int iVar1;
  pointer pLVar2;
  pointer pLVar3;
  double dVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  pointer puVar12;
  undefined8 uVar13;
  undefined7 in_register_00000011;
  uint uVar14;
  ulong uVar15;
  uint n_col;
  pointer this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_perceptrons;
  string line;
  Matrix weight;
  ifstream file;
  stringstream stream;
  undefined1 auStack_468 [8];
  ANN *local_460;
  undefined4 local_454;
  char *local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  double local_428;
  char *local_420;
  undefined8 local_418;
  char local_410;
  undefined7 uStack_40f;
  ulong local_400;
  ulong local_3f8;
  ulong local_3f0;
  Matrix local_3e8;
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_454 = (undefined4)CONCAT71(in_register_00000011,reinitialize);
  local_460 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_420 = &local_410;
  local_418 = 0;
  local_410 = '\0';
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_3c0,(string *)filepath,_S_in);
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) == 0) {
    cVar6 = std::ios::widen((char)auStack_468 + (char)*(long *)(local_3c0[0] + -0x18) + -0x58);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3c0,(string *)&local_420,cVar6);
    pcVar5 = local_420;
    piVar8 = __errno_location();
    iVar1 = *piVar8;
    *piVar8 = 0;
    uVar9 = strtol(pcVar5,&local_450,10);
    if (local_450 == pcVar5) {
      std::__throw_invalid_argument("stoi");
    }
    else {
      iVar7 = (int)uVar9;
      if (((long)iVar7 == uVar9) && (*piVar8 != 0x22)) {
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&local_448,uVar9 & 0xffffffff);
        if ((char)local_454 != '\0') {
          pLVar2 = (local_460->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pLVar3 = (local_460->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          this_00 = pLVar2;
          if (pLVar3 != pLVar2) {
            do {
              Layer::~Layer(this_00);
              this_00 = this_00 + 1;
            } while (this_00 != pLVar3);
            (local_460->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
            super__Vector_impl_data._M_finish = pLVar2;
          }
        }
        if (iVar7 != 0) {
          uVar15 = 0;
          do {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_420,',');
            pcVar5 = local_420;
            iVar1 = *piVar8;
            *piVar8 = 0;
            lVar10 = strtol(local_420,&local_450,10);
            if (local_450 == pcVar5) goto LAB_00103f39;
            if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_00103f45;
            if (*piVar8 == 0) {
              *piVar8 = iVar1;
            }
            local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] = (uint)lVar10;
            if ((char)local_454 != '\0') {
              insert_layer(local_460,(uint)uVar15,(uint)lVar10);
            }
            uVar15 = uVar15 + 1;
          } while ((uVar9 & 0xffffffff) != uVar15);
        }
        local_3f0 = (ulong)(iVar7 - 1);
        uVar9 = 0;
        do {
          if (uVar9 == local_3f0) {
            std::ifstream::close();
            std::ifstream::~ifstream(local_3c0);
            Matrix::~Matrix(&local_3e8);
            if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_448.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_448.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_448.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_420 != &local_410) {
              operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            return;
          }
          if ((char)local_454 != '\0') {
            Matrix::set_shape(&(local_460->m_layers).
                               super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9].m_weights,
                              local_448.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9 + 1],
                              local_448.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9]);
            Matrix::set_shape(&(local_460->m_layers).
                               super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar9].m_biases,1,
                              local_448.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9 + 1]);
          }
          uVar15 = uVar9 + 1;
          local_400 = uVar15 & 0xffffffff;
          if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[local_400] != 0) {
            uVar14 = 0;
            puVar12 = local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_3f8 = uVar15;
            do {
              if (puVar12[uVar9] != 0) {
                n_col = 0;
                do {
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_3c0,(string *)&local_420,',');
                  pcVar5 = local_420;
                  iVar1 = *piVar8;
                  *piVar8 = 0;
                  dVar4 = strtod(local_420,&local_450);
                  if (local_450 == pcVar5) {
                    std::__throw_invalid_argument("stod");
LAB_00103f15:
                    std::__throw_out_of_range("stod");
                    goto LAB_00103f21;
                  }
                  if (*piVar8 == 0) {
                    *piVar8 = iVar1;
                  }
                  else if (*piVar8 == 0x22) goto LAB_00103f15;
                  local_428 = dVar4;
                  pdVar11 = Matrix::set(&(local_460->m_layers).
                                         super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar9].m_weights,uVar14,
                                        n_col);
                  *pdVar11 = local_428;
                  n_col = n_col + 1;
                  puVar12 = local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = local_3f8;
                } while (n_col < local_448.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < puVar12[local_400]);
            if (puVar12[local_400] != 0) {
              uVar14 = 0;
              do {
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_3c0,(string *)&local_420,',');
                pcVar5 = local_420;
                iVar1 = *piVar8;
                *piVar8 = 0;
                dVar4 = strtod(local_420,&local_450);
                if (local_450 == pcVar5) goto LAB_00103f21;
                if (*piVar8 == 0) {
                  *piVar8 = iVar1;
                }
                else if (*piVar8 == 0x22) goto LAB_00103f2d;
                local_428 = dVar4;
                pdVar11 = Matrix::set(&(local_460->m_layers).
                                       super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar9].m_biases,0,uVar14);
                *pdVar11 = local_428;
                uVar14 = uVar14 + 1;
                uVar15 = local_3f8;
              } while (uVar14 < local_448.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_400]);
            }
          }
          uVar9 = uVar15;
          cVar6 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)local_3c0);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_420,cVar6);
        } while( true );
      }
    }
    uVar13 = std::__throw_out_of_range("stoi");
    Matrix::~Matrix(&local_3e8);
    if (local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    _Unwind_Resume(uVar13);
  }
LAB_00103f51:
  std::operator<<((ostream *)&std::cout,"ERROR [weight file]: Couldn\'t load weights!\n");
  exit(1);
LAB_00103f21:
  std::__throw_invalid_argument("stod");
LAB_00103f2d:
  std::__throw_out_of_range("stod");
LAB_00103f39:
  std::__throw_invalid_argument("stoi");
LAB_00103f45:
  std::__throw_out_of_range("stoi");
  goto LAB_00103f51;
}

Assistant:

void ANN::load(const std::string& filepath, bool reinitialize){
    std::stringstream stream;
    std::string line;
    uint n_layer;
    std::vector<uint> n_perceptrons, n_weights;
    Matrix weight;

    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [weight file]: Couldn't load weights!\n";
        exit(1);
    }

    std::getline(file, line);
    n_layer=std::stoi(line);
    n_perceptrons.resize(n_layer);

    if(reinitialize) m_layers.clear();
    for(uint i=0;i<n_layer;++i){
        std::getline(file, line, ',');
        n_perceptrons[i]=std::stoi(line);
        if(reinitialize) insert_layer(i, n_perceptrons[i]);
    }

    for(uint i=0;i<n_layer-1;++i){
        if(reinitialize){
            m_layers[i].weights().set_shape(n_perceptrons[i+1], n_perceptrons[i]);
            m_layers[i].biases().set_shape(1, n_perceptrons[i+1]);
        }
        for(uint j=0;j<n_perceptrons[i+1];++j){
            for(uint k=0;k<n_perceptrons[i];++k){
                std::getline(file, line, ',');
                m_layers[i].weights().set(j, k)=std::stod(line);
            }
        }
        for(uint k=0;k<n_perceptrons[i+1];++k){
            std::getline(file, line, ',');
            m_layers[i].biases().set(0, k)=std::stod(line);
        }   std::getline(file, line);
    }

    file.close();
}